

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  undefined1 local_1568 [8];
  Vector3d tRes_eig;
  Vector3d tRes_FA3Ri;
  Vector3d tRes_FA3Rd;
  Matrix3d rRes_eig;
  Matrix3d rRes_FA3Ri;
  Matrix3d rRes_FA3Rd;
  value_type local_1430;
  undefined1 local_1418 [8];
  MatrixXd Q_;
  undefined1 local_13f0 [8];
  MatrixXd P_;
  undefined1 local_13d0 [4];
  int i;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  Q;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  P;
  undefined1 local_1398 [4];
  int len;
  random_device rd;
  
  rd.field_0._M_mt._M_p._4_4_ = 0;
  std::random_device::random_device((random_device *)local_1398);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&Q.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_13d0);
  for (P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
            0; P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
               _4_4_ < 1000;
      P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
           P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
           _4_4_ + 1) {
    randomMatrix((MatrixXd *)local_13f0,3,1,(random_device *)local_1398);
    randomMatrix((MatrixXd *)local_1418,3,1,(random_device *)local_1398);
    Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,3,1,0,3,1> *)&local_1430,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_13f0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&Q.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1430);
    Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,3,1,0,3,1> *)
               (rRes_FA3Rd.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + 8),(EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1418
              );
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)local_13d0,
                (value_type *)
                (rRes_FA3Rd.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 8));
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_1418);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_13f0);
  }
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             (rRes_FA3Ri.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             (rRes_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             (tRes_FA3Rd.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (tRes_FA3Ri.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (tRes_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_1568);
  FA3R_double((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Q.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
              (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_13d0,(Matrix3d *)0x0,0x14,
              (Matrix3d *)
              (rRes_FA3Ri.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + 8),
              (Vector3d *)
              (tRes_FA3Ri.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array + 2));
  FA3R_int((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&Q.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
           (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_13d0,(Matrix3d *)0x0,0x14,
           (Matrix3d *)
           (rRes_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + 8),
           (Vector3d *)
           (tRes_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array + 2));
  eig3D_eig((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)&Q.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
            (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_13d0,(Matrix3d *)0x0,
            (Matrix3d *)
            (tRes_FA3Rd.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array + 2),(Vector3d *)local_1568);
  poVar1 = std::operator<<((ostream *)&std::cout,"FA3R double:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"R: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                    (rRes_FA3Ri.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array + 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"t: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                    (tRes_FA3Ri.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array + 2));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"FA3R int:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"R: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                    (rRes_eig.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array + 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"t: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                    (tRes_eig.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array + 2));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eig:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"R: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                    (tRes_FA3Rd.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array + 2));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"t: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1568);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  rd.field_0._M_mt._M_p._4_4_ = 0;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_13d0);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)&Q.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::random_device::~random_device((random_device *)local_1398);
  return rd.field_0._M_mt._M_p._4_4_;
}

Assistant:

int main()
{
	std::random_device rd;
	const int len = 1000;

	std::vector<Eigen::Vector3d> P, Q;
	for(int i = 0; i < len; ++i)
    {
	    auto P_ = randomMatrix(3, 1, &rd);
        auto Q_ = randomMatrix(3, 1, &rd);
        P.push_back(P_);
        Q.push_back(Q_);
    }

	Eigen::Matrix3d rRes_FA3Rd, rRes_FA3Ri, rRes_eig;
    Eigen::Vector3d tRes_FA3Rd, tRes_FA3Ri, tRes_eig;
    FA3R_double(&P, &Q, nullptr, 20, &rRes_FA3Rd, &tRes_FA3Rd);
    FA3R_int(&P, &Q, nullptr, 20, &rRes_FA3Ri, &tRes_FA3Ri);
    eig3D_eig(&P, &Q, nullptr, &rRes_eig, &tRes_eig);

    std::cout << "FA3R double:" << std::endl;
    std::cout << "R: " << rRes_FA3Rd << std::endl;
    std::cout << "t: " << tRes_FA3Rd << std::endl;
    std::cout << std::endl;
    std::cout << std::endl;

    std::cout << "FA3R int:" << std::endl;
    std::cout << "R: " << rRes_FA3Ri << std::endl;
    std::cout << "t: " << tRes_FA3Ri << std::endl;
    std::cout << std::endl;
    std::cout << std::endl;

    std::cout << "Eig:" << std::endl;
    std::cout << "R: " << rRes_eig << std::endl;
    std::cout << "t: " << tRes_eig << std::endl;

    return 0;
}